

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::short_level_formatter<spdlog::details::null_scoped_padder>::format
          (short_level_formatter<spdlog::details::null_scoped_padder> *this,log_msg *msg,tm *param_2
          ,memory_buf_t *dest)

{
  char *__s;
  size_t __n;
  ptrdiff_t _Num;
  char *buf_ptr;
  ulong uVar1;
  
  __s = *(char **)(level::short_level_names + (ulong)msg->level * 8);
  __n = strlen(__s);
  uVar1 = (dest->super_buffer<char>).size_ + __n;
  if ((dest->super_buffer<char>).capacity_ < uVar1) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar1);
  }
  if (__n != 0) {
    memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,__s,__n);
  }
  (dest->super_buffer<char>).size_ = uVar1;
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        string_view_t level_name{level::to_short_c_str(msg.level)};
        ScopedPadder p(level_name.size(), padinfo_, dest);
        fmt_helper::append_string_view(level_name, dest);
    }